

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::matchNext
          (GenMatcher *this,uint specVar,TermList nodeTerm,bool separate)

{
  bool bVar1;
  byte in_CL;
  uint in_ESI;
  long in_RDI;
  TermList queryTerm;
  undefined3 in_stack_00000020;
  Stack<unsigned_int> *in_stack_ffffffffffffffd0;
  
  if ((in_CL & 1) != 0) {
    Lib::Stack<unsigned_int>::push(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
  }
  Lib::DArray<Kernel::TermList>::operator[]
            ((DArray<Kernel::TermList> *)(in_RDI + 0x20),(ulong)in_ESI);
  bVar1 = matchNextAux((GenMatcher *)CONCAT44(specVar,_in_stack_00000020),nodeTerm,(TermList)this,
                       queryTerm._content._7_1_);
  return bVar1;
}

Assistant:

bool SubstitutionTree<LeafData_>::GenMatcher::matchNext(unsigned specVar, TermList nodeTerm, bool separate)
{
  if(separate) {
    _boundVars.push(BACKTRACK_SEPARATOR);
  }

  TermList queryTerm=(_specVars)[specVar];

  return matchNextAux(queryTerm, nodeTerm, separate);
}